

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void feature_limit(vw *all,example *ex)

{
  uint uVar1;
  byte *pbVar2;
  uchar **ppuVar3;
  size_t sVar4;
  v_array<unsigned_char> *in_RSI;
  long in_RDI;
  features *fs;
  namespace_index index;
  uchar *__end1;
  uchar *__begin1;
  v_array<unsigned_char> *__range1;
  int in_stack_0000005c;
  features *in_stack_00000060;
  uint64_t in_stack_000000f0;
  features *in_stack_000000f8;
  byte *local_20;
  
  ppuVar3 = v_array<unsigned_char>::begin(in_RSI);
  local_20 = *ppuVar3;
  ppuVar3 = v_array<unsigned_char>::end(in_RSI);
  pbVar2 = *ppuVar3;
  for (; local_20 != pbVar2; local_20 = local_20 + 1) {
    uVar1 = *(uint *)(in_RDI + 0xf00 + (ulong)*local_20 * 4);
    sVar4 = features::size((features *)0x25d5e7);
    if (uVar1 < sVar4) {
      features::sort(in_stack_000000f8,in_stack_000000f0);
      unique_features(in_stack_00000060,in_stack_0000005c);
    }
  }
  return;
}

Assistant:

void feature_limit(vw& all, example* ex)
{
  for (namespace_index index : ex->indices)
    if (all.limit[index] < ex->feature_space[index].size())
    {
      features& fs = ex->feature_space[index];
      fs.sort(all.parse_mask);
      unique_features(fs, all.limit[index]);
    }
}